

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::EnumDescriptorProto::Clear(EnumDescriptorProto *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  undefined8 *puVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = (long)(this->value_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->value_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      EnumValueDescriptorProto::Clear((EnumValueDescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->value_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      EnumDescriptorProto_EnumReservedRange::Clear
                ((EnumDescriptorProto_EnumReservedRange *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      puVar4 = (undefined8 *)pRVar3->elements[lVar6];
      lVar6 = lVar6 + 1;
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    } while (lVar7 != lVar6);
    (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar5 = (this->name_).ptr_;
      psVar5->_M_string_length = 0;
      *(psVar5->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 2) != 0) {
      EnumOptions::Clear(this->options_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void EnumDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  value_.Clear();
  reserved_range_.Clear();
  reserved_name_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}